

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool CyclicKeyTest<unsigned_int>
               (pfHash hash,int cycleLen,int cycleReps,int keycount,bool drawDiagram)

{
  code *pcVar1;
  byte bVar2;
  int iVar3;
  uint32_t uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  Rand *pRVar5;
  reference pvVar6;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  code *in_RDI;
  ulong uVar7;
  byte in_R8B;
  bool in_stack_0000001b;
  bool in_stack_0000001c;
  bool in_stack_0000001d;
  bool in_stack_0000001e;
  bool in_stack_0000001f;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000020;
  bool result;
  int j;
  int i;
  uint8_t *key;
  uint8_t *cycle;
  int keyLen;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashes;
  Rand r;
  uint32_t in_stack_ffffffffffffff2c;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined8 in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  Rand *in_stack_ffffffffffffff50;
  int local_68;
  uint local_64;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  byte local_15;
  uint local_14;
  uint local_10;
  uint local_c;
  code *local_8;
  
  local_15 = in_R8B & 1;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  printf("Keyset \'Cyclic\' - %d cycles of %d bytes - %d keys\n",(ulong)in_EDX,(ulong)in_ESI,
         (ulong)in_ECX);
  Rand::Rand((Rand *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff2c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x12cc97);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff50,
             CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  iVar3 = local_c * local_10;
  uVar7 = (ulong)(int)(local_c + 0x10);
  if ((long)uVar7 < 0) {
    uVar7 = 0xffffffffffffffff;
  }
  this = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new__(uVar7);
  uVar7 = (ulong)iVar3;
  if ((long)uVar7 < 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pRVar5 = (Rand *)operator_new__(uVar7);
  for (local_64 = 0; (int)local_64 < (int)local_14; local_64 = local_64 + 1) {
    Rand::rand_p(in_stack_ffffffffffffff50,
                 (void *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                 (int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    uVar4 = f3mix(local_64 ^ 0x746a94f1);
    pcVar1 = local_8;
    *(uint32_t *)
     &(this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start = uVar4;
    for (local_68 = 0; local_68 < iVar3; local_68 = local_68 + 1) {
      *(undefined1 *)((long)&pRVar5->x + (long)local_68) =
           *(undefined1 *)
            ((long)&(this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start + (long)(local_68 % (int)local_c));
    }
    in_stack_ffffffffffffff50 = pRVar5;
    pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_40,(long)(int)local_64);
    (*pcVar1)(in_stack_ffffffffffffff50,iVar3,0,pvVar6);
  }
  bVar2 = TestHashList<unsigned_int>
                    (in_stack_00000020,in_stack_0000001f,in_stack_0000001e,in_stack_0000001d,
                     in_stack_0000001c,in_stack_0000001b);
  printf("\n");
  if (this != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    operator_delete__(this);
  }
  if (pRVar5 != (Rand *)0x0) {
    operator_delete__(pRVar5);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this);
  return (bool)(bVar2 & 1);
}

Assistant:

bool CyclicKeyTest ( pfHash hash, int cycleLen, int cycleReps, const int keycount, bool drawDiagram )
{
  printf("Keyset 'Cyclic' - %d cycles of %d bytes - %d keys\n",cycleReps,cycleLen,keycount);

  Rand r(483723);

  std::vector<hashtype> hashes;
  hashes.resize(keycount);

  int keyLen = cycleLen * cycleReps;

  uint8_t * cycle = new uint8_t[cycleLen + 16];
  uint8_t * key = new uint8_t[keyLen];

  //----------

  for(int i = 0; i < keycount; i++)
  {
    r.rand_p(cycle,cycleLen);

    *(uint32_t*)cycle = f3mix(i ^ 0x746a94f1);

    for(int j = 0; j < keyLen; j++)
    {
      key[j] = cycle[j % cycleLen];
    }

    hash(key,keyLen,0,&hashes[i]);
  }

  //----------

  bool result = true;

  result &= TestHashList(hashes,drawDiagram);
  printf("\n");

  delete [] cycle;
  delete [] key;

  return result;
}